

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O3

QPlatformServiceColorPicker * __thiscall
QDesktopUnixServices::colorPicker(QDesktopUnixServices *this,QWindow *parent)

{
  char cVar1;
  QObject *this_00;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QArrayData *local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY");
  if (cVar1 != '\0') {
    QGuiApplication::platformName();
    QVar2.m_data = (char *)0x7;
    QVar2.m_size = (qsizetype)&local_48;
    cVar1 = QString::startsWith(QVar2,0x68143e);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (cVar1 == '\0') {
      this_00 = (QObject *)0x0;
      goto LAB_00621563;
    }
  }
  this_00 = (QObject *)operator_new(0x28);
  (*(this->super_QPlatformServices)._vptr_QPlatformServices[7])(&local_48,this,parent);
  QObject::QObject(this_00,&parent->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_007e2d30;
  *(QArrayData **)(this_00 + 0x10) = local_48;
  *(undefined8 *)(this_00 + 0x18) = local_40;
  *(undefined8 *)(this_00 + 0x20) = local_38;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
  }
LAB_00621563:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QPlatformServiceColorPicker *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformServiceColorPicker *QDesktopUnixServices::colorPicker(QWindow *parent)
{
#if QT_CONFIG(dbus)
    // Make double sure that we are in a wayland environment. In particular check
    // WAYLAND_DISPLAY so also XWayland apps benefit from portal-based color picking.
    // Outside wayland we'll rather rely on other means than the XDG desktop portal.
    if (!qEnvironmentVariableIsEmpty("WAYLAND_DISPLAY")
        || QGuiApplication::platformName().startsWith("wayland"_L1)) {
        return new XdgDesktopPortalColorPicker(portalWindowIdentifier(parent), parent);
    }
    return nullptr;
#else
    Q_UNUSED(parent);
    return nullptr;
#endif
}